

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O1

void sd_add_seq(kseq_t *seq,int file,int use_header)

{
  uint *puVar1;
  UT_hash_bucket *pUVar2;
  char *pcVar3;
  UT_hash_handle *pUVar4;
  UT_hash_table *pUVar5;
  UT_hash_handle *pUVar6;
  UT_hash_handle *pUVar7;
  undefined8 *__ptr;
  sd_lookup_t *psVar8;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  byte *pbVar12;
  sd_lookup_t *psVar13;
  byte *pbVar14;
  char *__dest;
  UT_hash_table *pUVar15;
  UT_hash_bucket *pUVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  void *__ptr_00;
  UT_hash_bucket *pUVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uchar *_hj_key_1;
  uchar *_hj_key;
  long lVar24;
  UT_hash_handle *pUVar25;
  
  psVar13 = sd_lookup;
  if (use_header == 0) {
    if (sd_lookup == (sd_lookup_t *)0x0) goto LAB_00102673;
    pbVar14 = (byte *)(seq->seq).s;
    sVar11 = strlen((char *)pbVar14);
    uVar9 = (uint)sVar11;
    pbVar12 = pbVar14;
    if (uVar9 < 0xc) {
      uVar17 = 0xfeedbeef;
      uVar19 = 0x9e3779b9;
      uVar18 = 0x9e3779b9;
      uVar21 = uVar9;
    }
    else {
      uVar18 = 0x9e3779b9;
      uVar17 = 0xfeedbeef;
      uVar19 = 0x9e3779b9;
      uVar23 = sVar11 & 0xffffffff;
      do {
        uVar17 = uVar17 + *(int *)(pbVar12 + 8);
        uVar21 = uVar17 >> 0xd ^
                 ((uVar18 + *(int *)pbVar12) - (uVar19 + *(int *)(pbVar12 + 4))) - uVar17;
        uVar19 = uVar21 << 8 ^ ((uVar19 + *(int *)(pbVar12 + 4)) - uVar17) - uVar21;
        uVar18 = uVar19 >> 0xd ^ (uVar17 - uVar21) - uVar19;
        uVar21 = uVar18 >> 0xc ^ (uVar21 - uVar19) - uVar18;
        uVar17 = uVar21 << 0x10 ^ (uVar19 - uVar18) - uVar21;
        uVar22 = uVar17 >> 5 ^ (uVar18 - uVar21) - uVar17;
        uVar18 = uVar22 >> 3 ^ (uVar21 - uVar17) - uVar22;
        uVar19 = uVar18 << 10 ^ (uVar17 - uVar22) - uVar18;
        uVar17 = uVar19 >> 0xf ^ (uVar22 - uVar18) - uVar19;
        pbVar12 = pbVar12 + 0xc;
        uVar21 = (int)uVar23 - 0xc;
        uVar23 = (ulong)uVar21;
      } while (0xb < uVar21);
    }
    uVar17 = uVar17 + uVar9;
    switch(uVar21) {
    case 0xb:
      uVar17 = (uint)pbVar12[10] * 0x1000000 + uVar17;
    case 10:
      uVar17 = (uint)pbVar12[9] * 0x10000 + uVar17;
    case 9:
      uVar17 = (uint)pbVar12[8] * 0x100 + uVar17;
    case 8:
      uVar19 = (uint)pbVar12[7] * 0x1000000 + uVar19;
    case 7:
      uVar19 = (uint)pbVar12[6] * 0x10000 + uVar19;
    case 6:
      uVar19 = (uint)pbVar12[5] * 0x100 + uVar19;
    case 5:
      uVar19 = pbVar12[4] + uVar19;
    case 4:
      uVar18 = (uint)pbVar12[3] * 0x1000000 + uVar18;
    case 3:
      uVar18 = (uint)pbVar12[2] * 0x10000 + uVar18;
    case 2:
      uVar18 = (uint)pbVar12[1] * 0x100 + uVar18;
    case 1:
      uVar18 = *pbVar12 + uVar18;
    default:
      uVar9 = uVar17 >> 0xd ^ (uVar18 - uVar19) - uVar17;
      uVar19 = uVar9 << 8 ^ (uVar19 - uVar17) - uVar9;
      uVar18 = uVar19 >> 0xd ^ (uVar17 - uVar9) - uVar19;
      uVar21 = uVar18 >> 0xc ^ (uVar9 - uVar19) - uVar18;
      uVar9 = uVar21 << 0x10 ^ (uVar19 - uVar18) - uVar21;
      uVar18 = uVar9 >> 5 ^ (uVar18 - uVar21) - uVar9;
      uVar21 = uVar18 >> 3 ^ (uVar21 - uVar9) - uVar18;
      uVar9 = uVar21 << 10 ^ (uVar9 - uVar18) - uVar21;
      pUVar15 = (psVar13->hh).tbl;
      pUVar25 = pUVar15->buckets
                [pUVar15->num_buckets - 1 & (uVar9 >> 0xf ^ uVar18 - (uVar21 + uVar9))].hh_head;
    }
    while( true ) {
      if (pUVar25 == (UT_hash_handle *)0x0) {
        lVar24 = 0;
      }
      else {
        lVar24 = (long)pUVar25 - pUVar15->hho;
      }
      if (lVar24 == 0) goto LAB_00102673;
      if ((sVar11 == *(uint *)(lVar24 + 0x58)) &&
         (iVar10 = bcmp(*(void **)(lVar24 + 0x50),pbVar14,sVar11), iVar10 == 0)) break;
      pUVar25 = *(UT_hash_handle **)(lVar24 + 0x48);
    }
  }
  else if (sd_lookup == (sd_lookup_t *)0x0) {
LAB_00102673:
    lVar24 = 0;
  }
  else {
    pbVar14 = (byte *)(seq->name).s;
    sVar11 = strlen((char *)pbVar14);
    uVar9 = (uint)sVar11;
    pbVar12 = pbVar14;
    if (uVar9 < 0xc) {
      uVar17 = 0xfeedbeef;
      uVar19 = 0x9e3779b9;
      uVar18 = 0x9e3779b9;
      uVar21 = uVar9;
    }
    else {
      uVar18 = 0x9e3779b9;
      uVar17 = 0xfeedbeef;
      uVar19 = 0x9e3779b9;
      uVar23 = sVar11 & 0xffffffff;
      do {
        uVar17 = uVar17 + *(int *)(pbVar12 + 8);
        uVar21 = uVar17 >> 0xd ^
                 ((uVar18 + *(int *)pbVar12) - (uVar19 + *(int *)(pbVar12 + 4))) - uVar17;
        uVar19 = uVar21 << 8 ^ ((uVar19 + *(int *)(pbVar12 + 4)) - uVar17) - uVar21;
        uVar18 = uVar19 >> 0xd ^ (uVar17 - uVar21) - uVar19;
        uVar21 = uVar18 >> 0xc ^ (uVar21 - uVar19) - uVar18;
        uVar17 = uVar21 << 0x10 ^ (uVar19 - uVar18) - uVar21;
        uVar22 = uVar17 >> 5 ^ (uVar18 - uVar21) - uVar17;
        uVar18 = uVar22 >> 3 ^ (uVar21 - uVar17) - uVar22;
        uVar19 = uVar18 << 10 ^ (uVar17 - uVar22) - uVar18;
        uVar17 = uVar19 >> 0xf ^ (uVar22 - uVar18) - uVar19;
        pbVar12 = pbVar12 + 0xc;
        uVar21 = (int)uVar23 - 0xc;
        uVar23 = (ulong)uVar21;
      } while (0xb < uVar21);
    }
    uVar17 = uVar17 + uVar9;
    switch(uVar21) {
    case 0xb:
      uVar17 = (uint)pbVar12[10] * 0x1000000 + uVar17;
    case 10:
      uVar17 = (uint)pbVar12[9] * 0x10000 + uVar17;
    case 9:
      uVar17 = (uint)pbVar12[8] * 0x100 + uVar17;
    case 8:
      uVar19 = (uint)pbVar12[7] * 0x1000000 + uVar19;
    case 7:
      uVar19 = (uint)pbVar12[6] * 0x10000 + uVar19;
    case 6:
      uVar19 = (uint)pbVar12[5] * 0x100 + uVar19;
    case 5:
      uVar19 = pbVar12[4] + uVar19;
    case 4:
      uVar18 = (uint)pbVar12[3] * 0x1000000 + uVar18;
    case 3:
      uVar18 = (uint)pbVar12[2] * 0x10000 + uVar18;
    case 2:
      uVar18 = (uint)pbVar12[1] * 0x100 + uVar18;
    case 1:
      uVar18 = *pbVar12 + uVar18;
    default:
      uVar9 = uVar17 >> 0xd ^ (uVar18 - uVar19) - uVar17;
      uVar19 = uVar9 << 8 ^ (uVar19 - uVar17) - uVar9;
      uVar18 = uVar19 >> 0xd ^ (uVar17 - uVar9) - uVar19;
      uVar21 = uVar18 >> 0xc ^ (uVar9 - uVar19) - uVar18;
      uVar9 = uVar21 << 0x10 ^ (uVar19 - uVar18) - uVar21;
      uVar18 = uVar9 >> 5 ^ (uVar18 - uVar21) - uVar9;
      uVar21 = uVar18 >> 3 ^ (uVar21 - uVar9) - uVar18;
      uVar9 = uVar21 << 10 ^ (uVar9 - uVar18) - uVar21;
      pUVar15 = (psVar13->hh).tbl;
      pUVar25 = pUVar15->buckets
                [pUVar15->num_buckets - 1 & (uVar9 >> 0xf ^ uVar18 - (uVar21 + uVar9))].hh_head;
    }
    while( true ) {
      if (pUVar25 == (UT_hash_handle *)0x0) {
        lVar24 = 0;
      }
      else {
        lVar24 = (long)pUVar25 - pUVar15->hho;
      }
      if (lVar24 == 0) goto LAB_00102673;
      if ((sVar11 == *(uint *)(lVar24 + 0x58)) &&
         (iVar10 = bcmp(*(void **)(lVar24 + 0x50),pbVar14,sVar11), iVar10 == 0)) break;
      pUVar25 = *(UT_hash_handle **)(lVar24 + 0x48);
    }
  }
  if (lVar24 != 0) {
    *(int *)(lVar24 + 0x18) = *(int *)(lVar24 + 0x18) + 1;
    if (file == 2) {
      *(undefined4 *)(lVar24 + 0x20) = 1;
    }
    else if (file == 1) {
      *(undefined4 *)(lVar24 + 0x1c) = 1;
    }
    return;
  }
  psVar13 = (sd_lookup_t *)malloc(0x60);
  if (psVar13 == (sd_lookup_t *)0x0) {
    sd_add_seq_cold_4();
LAB_0010300b:
    sd_add_seq_cold_3();
  }
  else {
    psVar13->seq = (char *)0x0;
    psVar13->name = (char *)0x0;
    psVar13->count = 1;
    psVar13->in_a = 0;
    psVar13->in_b = 0;
    pcVar3 = (seq->seq).s;
    sVar11 = strlen(pcVar3);
    pbVar14 = (byte *)malloc(sVar11 * 8 + 8);
    psVar13->seq = (char *)pbVar14;
    if (pbVar14 == (byte *)0x0) goto LAB_0010300b;
    sVar11 = strlen(pcVar3);
    strncpy((char *)pbVar14,pcVar3,sVar11 + 1);
    pcVar3 = (seq->name).s;
    sVar11 = strlen(pcVar3);
    pbVar12 = (byte *)malloc(sVar11 * 8 + 8);
    psVar13->name = (char *)pbVar12;
    if (pbVar12 != (byte *)0x0) {
      sVar11 = strlen(pcVar3);
      strncpy((char *)pbVar12,pcVar3,sVar11 + 1);
      pcVar3 = (seq->comment).s;
      if (pcVar3 == (char *)0x0) {
        psVar13->comment = (char *)0x0;
      }
      else {
        sVar11 = strlen(pcVar3);
        __ptr_00 = (void *)(sVar11 * 8 + 8);
        __dest = (char *)malloc((size_t)__ptr_00);
        psVar13->comment = __dest;
        if (__dest == (char *)0x0) {
          sd_add_seq_cold_1();
          if (__ptr_00 == (void *)0x0) {
            return;
          }
          free(*(void **)((long)__ptr_00 + 0x10));
          free(*(void **)((long)__ptr_00 + 0x28));
          free(*(void **)((long)__ptr_00 + 0x40));
          free(*(void **)((long)__ptr_00 + 0x58));
          __ptr = *(undefined8 **)((long)__ptr_00 + 0x68);
          if (__ptr != (undefined8 *)0x0) {
            free((void *)*__ptr);
            free(__ptr);
          }
          free(__ptr_00);
          return;
        }
        sVar11 = strlen(pcVar3);
        strncpy(__dest,pcVar3,sVar11 + 1);
      }
      if (file == 2) {
        psVar13->in_b = 1;
      }
      else if (file == 1) {
        psVar13->in_a = 1;
      }
      pUVar25 = &psVar13->hh;
      (psVar13->hh).next = (void *)0x0;
      if (use_header == 0) {
        (psVar13->hh).key = pbVar14;
        sVar11 = strlen((char *)pbVar14);
        (psVar13->hh).keylen = (uint)sVar11;
        if (sd_lookup == (sd_lookup_t *)0x0) {
          sd_lookup = psVar13;
          (psVar13->hh).prev = (void *)0x0;
          pUVar15 = (UT_hash_table *)malloc(0x40);
          (psVar13->hh).tbl = pUVar15;
          if (pUVar15 == (UT_hash_table *)0x0) goto LAB_00103015;
          *(undefined8 *)&pUVar15->num_items = 0;
          pUVar15->tail = (UT_hash_handle *)0x0;
          pUVar15->buckets = (UT_hash_bucket *)0x0;
          pUVar15->num_buckets = 0;
          pUVar15->log2_num_buckets = 0;
          pUVar15->hho = 0;
          pUVar15->ideal_chain_maxlen = 0;
          pUVar15->nonideal_items = 0;
          pUVar15->ineff_expands = 0;
          pUVar15->noexpand = 0;
          *(undefined8 *)&pUVar15->signature = 0;
          pUVar15->tail = pUVar25;
          pUVar15->num_buckets = 0x20;
          pUVar15->log2_num_buckets = 5;
          pUVar15->hho = 0x28;
          pUVar16 = (UT_hash_bucket *)malloc(0x200);
          pUVar15->buckets = pUVar16;
          if (pUVar16 == (UT_hash_bucket *)0x0) goto LAB_00103015;
          memset(pUVar16,0,0x200);
          pUVar15->signature = 0xa0111fe1;
        }
        else {
          pUVar15 = (sd_lookup->hh).tbl;
          pUVar4 = pUVar15->tail;
          pUVar4->next = psVar13;
          (psVar13->hh).prev = (void *)((long)pUVar4 - pUVar15->hho);
          pUVar15->tail = pUVar25;
        }
        psVar8 = sd_lookup;
        pUVar15 = (sd_lookup->hh).tbl;
        pUVar15->num_items = pUVar15->num_items + 1;
        (psVar13->hh).tbl = pUVar15;
        (psVar13->hh).hashv = 0xfeedbeef;
        sVar11 = strlen((char *)pbVar14);
        uVar21 = 0x9e3779b9;
        uVar9 = (uint)sVar11;
        if (uVar9 < 0xc) {
          uVar17 = 0x9e3779b9;
          uVar18 = uVar9;
        }
        else {
          uVar19 = (psVar13->hh).hashv;
          uVar17 = 0x9e3779b9;
          uVar23 = sVar11 & 0xffffffff;
          uVar21 = 0x9e3779b9;
          do {
            uVar19 = uVar19 + *(int *)(pbVar14 + 8);
            uVar22 = uVar19 >> 0xd ^
                     ((uVar21 + *(int *)pbVar14) - (uVar17 + *(int *)(pbVar14 + 4))) - uVar19;
            uVar18 = uVar22 << 8 ^ ((uVar17 + *(int *)(pbVar14 + 4)) - uVar19) - uVar22;
            uVar21 = uVar18 >> 0xd ^ (uVar19 - uVar22) - uVar18;
            uVar17 = uVar21 >> 0xc ^ (uVar22 - uVar18) - uVar21;
            uVar18 = uVar17 << 0x10 ^ (uVar18 - uVar21) - uVar17;
            uVar19 = uVar18 >> 5 ^ (uVar21 - uVar17) - uVar18;
            uVar21 = uVar19 >> 3 ^ (uVar17 - uVar18) - uVar19;
            uVar17 = uVar21 << 10 ^ (uVar18 - uVar19) - uVar21;
            uVar19 = uVar17 >> 0xf ^ (uVar19 - uVar21) - uVar17;
            pbVar14 = pbVar14 + 0xc;
            uVar18 = (int)uVar23 - 0xc;
            uVar23 = (ulong)uVar18;
          } while (0xb < uVar18);
          (psVar13->hh).hashv = uVar19;
        }
        uVar9 = uVar9 + (psVar13->hh).hashv;
        (psVar13->hh).hashv = uVar9;
        switch(uVar18) {
        case 0xb:
          (psVar13->hh).hashv = (uint)pbVar14[10] * 0x1000000 + uVar9;
        case 10:
          puVar1 = &(psVar13->hh).hashv;
          *puVar1 = *puVar1 + (uint)pbVar14[9] * 0x10000;
        case 9:
          puVar1 = &(psVar13->hh).hashv;
          *puVar1 = *puVar1 + (uint)pbVar14[8] * 0x100;
        case 8:
          uVar17 = (uint)pbVar14[7] * 0x1000000 + uVar17;
        case 7:
          uVar17 = (uint)pbVar14[6] * 0x10000 + uVar17;
        case 6:
          uVar17 = (uint)pbVar14[5] * 0x100 + uVar17;
        case 5:
          uVar17 = pbVar14[4] + uVar17;
        case 4:
          uVar21 = (uint)pbVar14[3] * 0x1000000 + uVar21;
        case 3:
          uVar21 = (uint)pbVar14[2] * 0x10000 + uVar21;
        case 2:
          uVar21 = (uint)pbVar14[1] * 0x100 + uVar21;
        case 1:
          uVar21 = *pbVar14 + uVar21;
        }
        uVar9 = (psVar13->hh).hashv;
        uVar19 = uVar9 >> 0xd ^ (uVar21 - uVar17) - uVar9;
        uVar18 = uVar19 << 8 ^ (uVar17 - uVar9) - uVar19;
        uVar21 = uVar18 >> 0xd ^ (uVar9 - uVar19) - uVar18;
        uVar9 = uVar21 >> 0xc ^ (uVar19 - uVar18) - uVar21;
        uVar18 = uVar9 << 0x10 ^ (uVar18 - uVar21) - uVar9;
        uVar21 = uVar18 >> 5 ^ (uVar21 - uVar9) - uVar18;
        uVar9 = uVar21 >> 3 ^ (uVar9 - uVar18) - uVar21;
        uVar18 = uVar9 << 10 ^ (uVar18 - uVar21) - uVar9;
        uVar9 = uVar18 >> 0xf ^ uVar21 - (uVar9 + uVar18);
        (psVar13->hh).hashv = uVar9;
        pUVar5 = (psVar8->hh).tbl;
        uVar9 = pUVar5->num_buckets - 1 & uVar9;
        pUVar16 = pUVar5->buckets;
        pUVar16[uVar9].count = pUVar16[uVar9].count + 1;
        pUVar4 = pUVar16[uVar9].hh_head;
        (psVar13->hh).hh_next = pUVar4;
        (psVar13->hh).hh_prev = (UT_hash_handle *)0x0;
        if (pUVar4 != (UT_hash_handle *)0x0) {
          pUVar4->hh_prev = pUVar25;
        }
        pUVar16[uVar9].hh_head = pUVar25;
        pUVar16 = ((sd_lookup->hh).tbl)->buckets;
        if (pUVar16[uVar9].count < pUVar16[uVar9].expand_mult * 10 + 10) {
          return;
        }
        if (pUVar15->noexpand == 1) {
          return;
        }
        sVar11 = (ulong)(pUVar15->num_buckets * 2) << 4;
        pUVar16 = (UT_hash_bucket *)malloc(sVar11);
        if (pUVar16 == (UT_hash_bucket *)0x0) goto LAB_00103015;
        memset(pUVar16,0,sVar11);
        uVar9 = pUVar15->num_buckets;
        uVar18 = uVar9 * 2 - 1;
        uVar21 = ((pUVar15->num_items >> ((char)pUVar15->log2_num_buckets + 1U & 0x1f)) + 1) -
                 (uint)((uVar18 & pUVar15->num_items) == 0);
        pUVar15->ideal_chain_maxlen = uVar21;
        pUVar15->nonideal_items = 0;
        if ((ulong)uVar9 != 0) {
          pUVar20 = pUVar15->buckets;
          uVar23 = 0;
          do {
            pUVar4 = pUVar20[uVar23].hh_head;
            while (pUVar4 != (UT_hash_handle *)0x0) {
              pUVar6 = pUVar4->hh_next;
              uVar19 = pUVar4->hashv & uVar18;
              pUVar2 = pUVar16 + uVar19;
              uVar17 = pUVar16[uVar19].count + 1;
              pUVar16[uVar19].count = uVar17;
              if (uVar21 < uVar17) {
                pUVar15->nonideal_items = pUVar15->nonideal_items + 1;
                pUVar2->expand_mult = uVar17 / uVar21;
              }
              pUVar4->hh_prev = (UT_hash_handle *)0x0;
              pUVar7 = pUVar2->hh_head;
              pUVar4->hh_next = pUVar7;
              if (pUVar7 != (UT_hash_handle *)0x0) {
                pUVar7->hh_prev = pUVar4;
              }
              pUVar2->hh_head = pUVar4;
              pUVar4 = pUVar6;
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar9);
        }
        pUVar20 = pUVar15->buckets;
LAB_00102fc7:
        uVar9 = 0;
        free(pUVar20);
        pUVar15 = pUVar25->tbl;
        pUVar15->num_buckets = pUVar15->num_buckets << 1;
        pUVar15->log2_num_buckets = pUVar15->log2_num_buckets + 1;
        pUVar15->buckets = pUVar16;
        if (pUVar15->num_items >> 1 < pUVar15->nonideal_items) {
          uVar9 = pUVar15->ineff_expands + 1;
        }
        pUVar15->ineff_expands = uVar9;
        if (uVar9 < 2) {
          return;
        }
        pUVar15->noexpand = 1;
        return;
      }
      (psVar13->hh).key = pbVar12;
      sVar11 = strlen((char *)pbVar12);
      (psVar13->hh).keylen = (uint)sVar11;
      if (sd_lookup == (sd_lookup_t *)0x0) {
        sd_lookup = psVar13;
        (psVar13->hh).prev = (void *)0x0;
        pUVar15 = (UT_hash_table *)malloc(0x40);
        (psVar13->hh).tbl = pUVar15;
        if (pUVar15 == (UT_hash_table *)0x0) goto LAB_00103015;
        *(undefined8 *)&pUVar15->num_items = 0;
        pUVar15->tail = (UT_hash_handle *)0x0;
        pUVar15->buckets = (UT_hash_bucket *)0x0;
        pUVar15->num_buckets = 0;
        pUVar15->log2_num_buckets = 0;
        pUVar15->hho = 0;
        pUVar15->ideal_chain_maxlen = 0;
        pUVar15->nonideal_items = 0;
        pUVar15->ineff_expands = 0;
        pUVar15->noexpand = 0;
        *(undefined8 *)&pUVar15->signature = 0;
        pUVar15->tail = pUVar25;
        pUVar15->num_buckets = 0x20;
        pUVar15->log2_num_buckets = 5;
        pUVar15->hho = 0x28;
        pUVar16 = (UT_hash_bucket *)malloc(0x200);
        pUVar15->buckets = pUVar16;
        if (pUVar16 == (UT_hash_bucket *)0x0) goto LAB_00103015;
        memset(pUVar16,0,0x200);
        pUVar15->signature = 0xa0111fe1;
      }
      else {
        pUVar15 = (sd_lookup->hh).tbl;
        pUVar4 = pUVar15->tail;
        pUVar4->next = psVar13;
        (psVar13->hh).prev = (void *)((long)pUVar4 - pUVar15->hho);
        pUVar15->tail = pUVar25;
      }
      psVar8 = sd_lookup;
      pUVar15 = (sd_lookup->hh).tbl;
      pUVar15->num_items = pUVar15->num_items + 1;
      (psVar13->hh).tbl = pUVar15;
      (psVar13->hh).hashv = 0xfeedbeef;
      sVar11 = strlen((char *)pbVar12);
      uVar21 = 0x9e3779b9;
      uVar9 = (uint)sVar11;
      if (uVar9 < 0xc) {
        uVar17 = 0x9e3779b9;
        uVar18 = uVar9;
      }
      else {
        uVar19 = (psVar13->hh).hashv;
        uVar17 = 0x9e3779b9;
        uVar23 = sVar11 & 0xffffffff;
        uVar21 = 0x9e3779b9;
        do {
          uVar19 = uVar19 + *(int *)(pbVar12 + 8);
          uVar22 = uVar19 >> 0xd ^
                   ((uVar21 + *(int *)pbVar12) - (uVar17 + *(int *)(pbVar12 + 4))) - uVar19;
          uVar18 = uVar22 << 8 ^ ((uVar17 + *(int *)(pbVar12 + 4)) - uVar19) - uVar22;
          uVar21 = uVar18 >> 0xd ^ (uVar19 - uVar22) - uVar18;
          uVar17 = uVar21 >> 0xc ^ (uVar22 - uVar18) - uVar21;
          uVar18 = uVar17 << 0x10 ^ (uVar18 - uVar21) - uVar17;
          uVar19 = uVar18 >> 5 ^ (uVar21 - uVar17) - uVar18;
          uVar21 = uVar19 >> 3 ^ (uVar17 - uVar18) - uVar19;
          uVar17 = uVar21 << 10 ^ (uVar18 - uVar19) - uVar21;
          uVar19 = uVar17 >> 0xf ^ (uVar19 - uVar21) - uVar17;
          pbVar12 = pbVar12 + 0xc;
          uVar18 = (int)uVar23 - 0xc;
          uVar23 = (ulong)uVar18;
        } while (0xb < uVar18);
        (psVar13->hh).hashv = uVar19;
      }
      uVar9 = uVar9 + (psVar13->hh).hashv;
      (psVar13->hh).hashv = uVar9;
      switch(uVar18) {
      case 0xb:
        (psVar13->hh).hashv = (uint)pbVar12[10] * 0x1000000 + uVar9;
      case 10:
        puVar1 = &(psVar13->hh).hashv;
        *puVar1 = *puVar1 + (uint)pbVar12[9] * 0x10000;
      case 9:
        puVar1 = &(psVar13->hh).hashv;
        *puVar1 = *puVar1 + (uint)pbVar12[8] * 0x100;
      case 8:
        uVar17 = (uint)pbVar12[7] * 0x1000000 + uVar17;
      case 7:
        uVar17 = (uint)pbVar12[6] * 0x10000 + uVar17;
      case 6:
        uVar17 = (uint)pbVar12[5] * 0x100 + uVar17;
      case 5:
        uVar17 = pbVar12[4] + uVar17;
      case 4:
        uVar21 = (uint)pbVar12[3] * 0x1000000 + uVar21;
      case 3:
        uVar21 = (uint)pbVar12[2] * 0x10000 + uVar21;
      case 2:
        uVar21 = (uint)pbVar12[1] * 0x100 + uVar21;
      case 1:
        uVar21 = *pbVar12 + uVar21;
      }
      uVar9 = (psVar13->hh).hashv;
      uVar19 = uVar9 >> 0xd ^ (uVar21 - uVar17) - uVar9;
      uVar18 = uVar19 << 8 ^ (uVar17 - uVar9) - uVar19;
      uVar21 = uVar18 >> 0xd ^ (uVar9 - uVar19) - uVar18;
      uVar9 = uVar21 >> 0xc ^ (uVar19 - uVar18) - uVar21;
      uVar18 = uVar9 << 0x10 ^ (uVar18 - uVar21) - uVar9;
      uVar21 = uVar18 >> 5 ^ (uVar21 - uVar9) - uVar18;
      uVar9 = uVar21 >> 3 ^ (uVar9 - uVar18) - uVar21;
      uVar18 = uVar9 << 10 ^ (uVar18 - uVar21) - uVar9;
      uVar9 = uVar18 >> 0xf ^ uVar21 - (uVar9 + uVar18);
      (psVar13->hh).hashv = uVar9;
      pUVar5 = (psVar8->hh).tbl;
      uVar9 = pUVar5->num_buckets - 1 & uVar9;
      pUVar16 = pUVar5->buckets;
      pUVar16[uVar9].count = pUVar16[uVar9].count + 1;
      pUVar4 = pUVar16[uVar9].hh_head;
      (psVar13->hh).hh_next = pUVar4;
      (psVar13->hh).hh_prev = (UT_hash_handle *)0x0;
      if (pUVar4 != (UT_hash_handle *)0x0) {
        pUVar4->hh_prev = pUVar25;
      }
      pUVar16[uVar9].hh_head = pUVar25;
      pUVar16 = ((sd_lookup->hh).tbl)->buckets;
      if (pUVar16[uVar9].count < pUVar16[uVar9].expand_mult * 10 + 10) {
        return;
      }
      if (pUVar15->noexpand == 1) {
        return;
      }
      sVar11 = (ulong)(pUVar15->num_buckets * 2) << 4;
      pUVar16 = (UT_hash_bucket *)malloc(sVar11);
      if (pUVar16 != (UT_hash_bucket *)0x0) {
        memset(pUVar16,0,sVar11);
        uVar9 = pUVar15->num_buckets;
        uVar18 = uVar9 * 2 - 1;
        uVar21 = ((pUVar15->num_items >> ((char)pUVar15->log2_num_buckets + 1U & 0x1f)) + 1) -
                 (uint)((uVar18 & pUVar15->num_items) == 0);
        pUVar15->ideal_chain_maxlen = uVar21;
        pUVar15->nonideal_items = 0;
        if ((ulong)uVar9 != 0) {
          pUVar20 = pUVar15->buckets;
          uVar23 = 0;
          do {
            pUVar4 = pUVar20[uVar23].hh_head;
            while (pUVar4 != (UT_hash_handle *)0x0) {
              pUVar6 = pUVar4->hh_next;
              uVar19 = pUVar4->hashv & uVar18;
              pUVar2 = pUVar16 + uVar19;
              uVar17 = pUVar16[uVar19].count + 1;
              pUVar16[uVar19].count = uVar17;
              if (uVar21 < uVar17) {
                pUVar15->nonideal_items = pUVar15->nonideal_items + 1;
                pUVar2->expand_mult = uVar17 / uVar21;
              }
              pUVar4->hh_prev = (UT_hash_handle *)0x0;
              pUVar7 = pUVar2->hh_head;
              pUVar4->hh_next = pUVar7;
              if (pUVar7 != (UT_hash_handle *)0x0) {
                pUVar7->hh_prev = pUVar4;
              }
              pUVar2->hh_head = pUVar4;
              pUVar4 = pUVar6;
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar9);
        }
        pUVar20 = pUVar15->buckets;
        goto LAB_00102fc7;
      }
      goto LAB_00103015;
    }
  }
  sd_add_seq_cold_2();
LAB_00103015:
  exit(-1);
}

Assistant:

void sd_add_seq(kseq_t *seq, int file, int use_header)
{
	sd_lookup_t *s;

	if (use_header)
		HASH_FIND_STR(sd_lookup,seq->name.s,s);
	else
		HASH_FIND_STR(sd_lookup,seq->seq.s,s);

	if (s==NULL) { /* key is not in hash */
		s = (sd_lookup_t *)malloc(sizeof(sd_lookup_t));
		if (s == NULL) {
			fprintf(stderr,"couldn't get memory for sd_lookup_t\n");
			exit(EXIT_FAILURE);
		} else {
			/* initialize struct */
			s->seq = NULL;
			s->name = NULL;
			s->count = 1;
			s->in_a = 0;
			s->in_b = 0;
		}

		s->seq = (char *)malloc((sizeof(char*) * (strlen(seq->seq.s)+1)));
		if (s->seq == NULL) {
			fprintf(stderr,"couldn't get memory for seq string\n");
			exit(EXIT_FAILURE);
		} else
			strncpy(s->seq,seq->seq.s,strlen(seq->seq.s)+1);

		s->name = (char *)malloc((sizeof(char*) * (strlen(seq->name.s)+1)));
		if (s->name == NULL) {
			fprintf(stderr,"couldn't get memory for name string\n");
			exit(EXIT_FAILURE);
		} else
			strncpy(s->name,seq->name.s,strlen(seq->name.s)+1);

		if (seq->comment.s != NULL) {
			s->comment = (char *)malloc((sizeof(char*) * (strlen(seq->comment.s)+1)));
			if (s->comment == NULL) {
				fprintf(stderr,"couldn't get memory for comment string\n");
				exit(EXIT_FAILURE);
			} else
				strncpy(s->comment,seq->comment.s,strlen(seq->comment.s)+1);
		} else
			s->comment = NULL;

		if (file == 1)
			s->in_a = 1;
		else if (file == 2)
			s->in_b = 1;
		if (use_header)
			HASH_ADD_KEYPTR( hh, sd_lookup, s->name, strlen(s->name), s );
		else
			HASH_ADD_KEYPTR( hh, sd_lookup, s->seq, strlen(s->seq), s );
	} else {
		s->count++; /* key is already in the hash, just incr count */
		if (file == 1)
			s->in_a = 1;
		else if (file == 2)
			s->in_b = 1;
	}
}